

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_unit.cpp
# Opt level: O3

pair<doublechecked::Roaring64Map,_doublechecked::Roaring64Map> * make_two_big_roaring64_maps(void)

{
  result_type x;
  result_type rVar1;
  long lVar2;
  pair<doublechecked::Roaring64Map,_doublechecked::Roaring64Map> *in_RDI;
  default_random_engine engine;
  uniform_int_distribution<unsigned_long> rng;
  result_type local_130;
  pair<doublechecked::Roaring64Map,_doublechecked::Roaring64Map> *local_128;
  linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> local_120;
  undefined1 local_118 [64];
  _Rb_tree_node_base local_d8;
  size_t local_b8;
  undefined1 local_a8 [64];
  _Rb_tree_node_base local_68;
  size_t local_48;
  uniform_int_distribution<unsigned_long> local_40;
  
  local_a8._24_8_ = local_a8 + 8;
  local_a8._16_8_ = (_Base_ptr)0x0;
  local_a8._40_8_ = 0;
  local_a8._48_8_ = 0;
  local_a8._0_8_ = 0;
  local_a8._8_8_ = 0;
  local_68._M_left = &local_68;
  local_68._M_color = _S_red;
  local_68._M_parent = (_Base_ptr)0x0;
  local_48 = 0;
  local_118._24_8_ = local_118 + 8;
  local_118._16_8_ = (_Base_ptr)0x0;
  local_118._40_8_ = 0;
  local_118._48_8_ = 0;
  local_118._0_8_ = 0;
  local_118._8_8_ = 0;
  local_d8._M_left = &local_d8;
  local_d8._M_color = _S_red;
  local_d8._M_parent = (_Base_ptr)0x0;
  local_b8 = 0;
  local_120._M_x = 0x5eadbef0;
  local_40._M_param._M_a = 0;
  local_40._M_param._M_b = 0xffffffffffffffff;
  lVar2 = 1000000;
  local_128 = in_RDI;
  local_118._32_8_ = local_118._24_8_;
  local_d8._M_right = local_d8._M_left;
  local_a8._32_8_ = local_a8._24_8_;
  local_68._M_right = local_68._M_left;
  do {
    x = std::uniform_int_distribution<unsigned_long>::operator()
                  (&local_40,&local_120,&local_40._M_param);
    rVar1 = std::uniform_int_distribution<unsigned_long>::operator()
                      (&local_40,&local_120,&local_40._M_param);
    local_130 = x;
    switch((uint)rVar1 & 3) {
    case 0:
      roaring::Roaring64Map::add((Roaring64Map *)local_a8,x);
      std::
      _Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
      ::_M_insert_unique<unsigned_long_const&>
                ((_Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
                  *)(local_a8 + 0x38),&local_130);
      break;
    case 1:
      roaring::Roaring64Map::add((Roaring64Map *)local_118,x);
      std::
      _Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
      ::_M_insert_unique<unsigned_long_const&>
                ((_Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
                  *)(local_118 + 0x38),&local_130);
      break;
    case 2:
      roaring::Roaring64Map::add((Roaring64Map *)local_a8,x);
      std::
      _Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
      ::_M_insert_unique<unsigned_long_const&>
                ((_Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
                  *)(local_a8 + 0x38),&local_130);
      local_130 = x;
      roaring::Roaring64Map::add((Roaring64Map *)local_118,x);
      std::
      _Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
      ::_M_insert_unique<unsigned_long_const&>
                ((_Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
                  *)(local_118 + 0x38),&local_130);
      break;
    case 3:
      roaring::Roaring64Map::add((Roaring64Map *)local_a8,x);
      std::
      _Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
      ::_M_insert_unique<unsigned_long_const&>
                ((_Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
                  *)(local_a8 + 0x38),&local_130);
      local_130 = x + 1;
      roaring::Roaring64Map::add((Roaring64Map *)local_118,local_130);
      std::
      _Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
      ::_M_insert_unique<unsigned_long_const&>
                ((_Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
                  *)(local_118 + 0x38),&local_130);
    }
    lVar2 = lVar2 + -1;
  } while (lVar2 != 0);
  doublechecked::Roaring64Map::Roaring64Map(&local_128->first,(Roaring64Map *)local_a8);
  doublechecked::Roaring64Map::Roaring64Map(&local_128->second,(Roaring64Map *)local_118);
  doublechecked::Roaring64Map::~Roaring64Map((Roaring64Map *)local_118);
  doublechecked::Roaring64Map::~Roaring64Map((Roaring64Map *)local_a8);
  return local_128;
}

Assistant:

std::pair<doublechecked::Roaring64Map, doublechecked::Roaring64Map>
make_two_big_roaring64_maps() {
    // Insert a large number of pseudorandom numbers into two sets.
    const uint32_t randomSeed = 0xdeadbeef;
    const size_t numValues = 1000000;  // 1 million

    doublechecked::Roaring64Map roaring1;
    doublechecked::Roaring64Map roaring2;

    std::default_random_engine engine(randomSeed);
    std::uniform_int_distribution<uint64_t> rng;

    for (size_t i = 0; i < numValues; ++i) {
        auto value = rng(engine);
        auto choice = rng(engine) % 4;
        switch (choice) {
            case 0: {
                // Value is added only to set 1.
                roaring1.add(value);
                break;
            }

            case 1: {
                // Value is added only to set 2.
                roaring2.add(value);
                break;
            }

            case 2: {
                // Value is added to both sets.
                roaring1.add(value);
                roaring2.add(value);
                break;
            }

            case 3: {
                // Value is added to set 1, and a slightly different value
                // is added to set 2. This makes it likely that they are in
                // the same "outer" bin, but at a different "inner" position.
                roaring1.add(value);
                roaring2.add(value + 1);
                break;
            }

            default:
                assert_true(false);
        }
    }
    return std::make_pair(std::move(roaring1), std::move(roaring2));
}